

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

ParsedInt anon_unknown.dwarf_cc2be5::readInt(QStringView text)

{
  long lVar1;
  storage_type_conflict *in_RCX;
  char *out;
  long in_FS_OFFSET;
  QSimpleParsedNumber<unsigned_long_long> QVar2;
  ParsedInt PVar3;
  QStringView in;
  QVarLengthArray<char,_256LL> latin1;
  
  out = (char *)text.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (out == (char *)0x0) {
    QVar2 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
  }
  else {
    memset(&latin1,0xaa,0x118);
    QVarLengthArray<char,_256LL>::QVarLengthArray(&latin1,(qsizetype)out);
    in.m_data = in_RCX;
    in.m_size = (qsizetype)text.m_data;
    QLatin1::convertFromUnicode
              ((QLatin1 *)latin1.super_QVLABase<char>.super_QVLABaseBase.ptr,out,in);
    if ((latin1.super_QVLABase<char>.super_QVLABaseBase.s == 0) ||
       (9 < (int)*latin1.super_QVLABase<char>.super_QVLABaseBase.ptr - 0x30U)) {
      QVar2 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
    }
    else {
      QVar2 = qstrntoull((char *)latin1.super_QVLABase<char>.super_QVLABaseBase.ptr,
                         latin1.super_QVLABase<char>.super_QVLABaseBase.s,10);
      if (QVar2.used != latin1.super_QVLABase<char>.super_QVLABaseBase.s) {
        QVar2 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
      }
    }
    QVarLengthArray<char,_256LL>::~QVarLengthArray(&latin1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    PVar3.result = QVar2.result;
    PVar3.used = QVar2.used;
    return PVar3;
  }
  __stack_chk_fail();
}

Assistant:

ParsedInt readInt(QStringView text)
{
    if (text.isEmpty())
        return {};

    // Converting to Latin-1 because QStringView::toULongLong() works with
    // US-ASCII only by design anyway.
    // Also QStringView::toULongLong() can't be used here as it will happily ignore
    // spaces and accept signs; but various date formats' fields (e.g. all in ISO)
    // should not.
    QVarLengthArray<char> latin1(text.size());
    QLatin1::convertFromUnicode(latin1.data(), text);
    return readInt(QLatin1StringView{latin1.data(), latin1.size()});
}